

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

MIR_reg_t to_reg(MIR_context_t ctx,uint64_t reg_str_num,MIR_item_t_conflict func)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bin_tag_t bVar9;
  MIR_reg_t MVar10;
  reg_desc_t *prVar11;
  ulong uVar12;
  MIR_context_t ctx_00;
  MIR_func_t func_00;
  ulong uVar13;
  ulong uVar14;
  char *func_01;
  MIR_context_t ctx_01;
  ulong *__s;
  ulong uVar15;
  MIR_str_t MVar16;
  token_attr_t tStack_40;
  MIR_context_t pMStack_28;
  MIR_context_t pMStack_20;
  
  pMStack_20 = (MIR_context_t)0x144f33;
  MVar16 = to_str(ctx,reg_str_num);
  ctx_00 = (MIR_context_t)MVar16.s;
  pMStack_20 = (MIR_context_t)0x144f4d;
  process_reserved_name((char *)ctx_00,"t",&((func->u).func)->last_temp_num);
  pMStack_20 = (MIR_context_t)0x144f5d;
  prVar11 = find_rd_by_name(ctx_00,(char *)((func->u).func)->internal,func_00);
  if (prVar11 != (reg_desc_t *)0x0) {
    return prVar11->reg;
  }
  func_01 = "undeclared func reg %s";
  ctx_01 = (MIR_context_t)0xf;
  pMStack_20 = (MIR_context_t)read_reg;
  (*ctx->error_func)(MIR_undeclared_func_reg_error,"undeclared func reg %s",ctx_00);
  pMStack_28 = ctx;
  pMStack_20 = ctx_00;
  bVar9 = read_token(ctx_01,&tStack_40);
  if (0xfffffffb < bVar9 - TAG_NAME1) {
    MVar10 = to_reg(ctx_01,tStack_40.u,(MIR_item_t_conflict)func_01);
    return MVar10;
  }
  __s = (ulong *)&DAT_00000002;
  (*ctx_01->error_func)(MIR_binary_io_error,"register has wrong tag %d",(ulong)bVar9);
  uVar12 = strlen((char *)__s);
  uVar13 = uVar12;
  for (; 0xf < uVar12; uVar12 = uVar12 - 0x10) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *__s;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = __s[1];
    __s = __s + 2;
    uVar13 = SUB168(ZEXT816(0x288eea216831e6a7) * auVar7,8) +
             SUB168(ZEXT816(0x288eea216831e6a7) * auVar7,0) ^
             SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar6,8) +
             SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar6,0) ^ uVar13;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar13;
    uVar13 = SUB168(auVar2 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar2 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar13;
  }
  if (7 < uVar12) {
    uVar12 = uVar12 - 8;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *__s;
    __s = __s + 1;
    uVar13 = uVar13 ^ SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar8,8) +
                      SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar8,0);
  }
  if (uVar12 != 0) {
    if (uVar12 < 4) {
      uVar15 = 0;
      uVar14 = 0;
    }
    else {
      uVar15 = 4;
      uVar14 = (ulong)(uint)*__s << 0x20;
    }
    if (uVar15 < uVar12) {
      do {
        pbVar1 = (byte *)((long)__s + uVar15);
        uVar15 = uVar15 + 1;
        uVar14 = uVar14 >> 8 | (ulong)*pbVar1 << 0x38;
      } while (uVar12 != uVar15);
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar14;
    uVar13 = uVar13 ^ SUB168(auVar3 * ZEXT816(0x288eea216831e6a7),8) +
                      SUB168(auVar3 * ZEXT816(0x288eea216831e6a7),0);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar13;
  uVar13 = SUB168(auVar4 * ZEXT816(0x65862b62bdf5ef4d),8) +
           SUB168(auVar4 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar13;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar13;
  return (uint)uVar13 ^
         SUB164(auVar5 * ZEXT816(0x288eea216831e6a7),8) +
         SUB164(auVar5 * ZEXT816(0x288eea216831e6a7),0);
}

Assistant:

static MIR_reg_t to_reg (MIR_context_t ctx, uint64_t reg_str_num, MIR_item_t func) {
  const char *s = to_str (ctx, reg_str_num).s;

  process_reserved_name (s, TEMP_REG_NAME_PREFIX, &func->u.func->last_temp_num);
  return MIR_reg (ctx, s, func->u.func);
}